

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString StringFromFormat(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t extraout_RDX;
  __va_list_tag *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  SimpleString SVar1;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  SimpleString local_48;
  undefined4 local_38;
  undefined4 local_34;
  va_list arguments;
  char *format_local;
  SimpleString *resultString;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  arguments[0].reg_save_area._7_1_ = 0;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  SimpleString::SimpleString((SimpleString *)format,"");
  arguments[0].overflow_arg_area = local_108;
  arguments[0]._0_8_ = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x10;
  VStringFromFormat((char *)&local_48,in_RSI);
  SimpleString::operator=((SimpleString *)format,&local_48);
  SimpleString::~SimpleString(&local_48);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = format;
  return SVar1;
}

Assistant:

SimpleString StringFromFormat(const char* format, ...)
{
    SimpleString resultString;
    va_list arguments;
    va_start(arguments, format);

    resultString = VStringFromFormat(format, arguments);
    va_end(arguments);
    return resultString;
}